

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O0

MPP_RET avs2d_parse_sequence_header(Avs2dCtx_t *p_dec)

{
  MPP_RET MVar1;
  int local_dc;
  RK_U8 local_d8 [4];
  RK_S32 _out_35;
  RK_S32 _out_34;
  RK_S32 _out_33;
  RK_S32 _out_32;
  RK_S32 _out_31;
  RK_U8 aRStack_c0 [3];
  RK_U8 bval_2;
  RK_S32 _out_30;
  RK_S32 _out_29;
  RK_S32 _out_28;
  RK_S32 _out_27;
  RK_S32 _out_26;
  RK_S32 _out_25;
  RK_S32 _out_24;
  RK_S32 _out_23;
  RK_S32 _out_22;
  RK_S32 _out_21;
  RK_S32 _out_20;
  RK_S32 _out_19;
  RK_S32 _out_18;
  RK_S32 _out_17;
  RK_S32 _out_16;
  RK_S32 _out_15;
  int iStack_7c;
  RK_U8 bval_1;
  RK_S32 _out_14;
  RK_S32 _out_13;
  RK_S32 _out_12;
  byte abStack_6c [3];
  RK_U8 bval;
  RK_S32 _out_11;
  RK_S32 _out_10;
  RK_S32 _out_9;
  RK_S32 _out_8;
  RK_S32 _out_7;
  RK_S32 _out_6;
  RK_S32 _out_5;
  RK_S32 _out_4;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 _out;
  Avs2dSeqHeader_t *vsh;
  BitReadCtx_t *bitctx;
  Avs2dRps_t *rps;
  uint local_20;
  RK_U32 val_temp;
  RK_U32 i;
  MPP_RET ret;
  Avs2dCtx_t *p_dec_local;
  
  val_temp = 0;
  rps._4_4_ = 0;
  bitctx = (BitReadCtx_t *)0x0;
  vsh = (Avs2dSeqHeader_t *)&p_dec->bitctx;
  __out_1 = &p_dec->vsh;
  _i = p_dec;
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","Bitread buf %p, data %p, buf_len %d, left %d\n",
               "avs2d_parse_sequence_header",(p_dec->bitctx).buf,((BitReadCtx_t *)vsh)->data_,
               (p_dec->bitctx).buf_len,(p_dec->bitctx).bytes_left_);
  }
  memset(__out_1,0,0x530);
  MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,8,&_out_2);
  vsh->seq_rps[0].reserved = MVar1;
  if (vsh->seq_rps[0].reserved == 0) {
    __out_1->profile_id = (RK_U8)_out_2;
    if (((__out_1->profile_id != '\x12') && (__out_1->profile_id != ' ')) &&
       (__out_1->profile_id != '\"')) {
      val_temp = 0xffffffff;
      _mpp_log_l(2,"avs2d_ps","profile_id 0x%02x is not supported.\n","avs2d_parse_sequence_header",
                 (ulong)__out_1->profile_id);
      return val_temp;
    }
    MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,8,&_out_3);
    vsh->seq_rps[0].reserved = MVar1;
    if (vsh->seq_rps[0].reserved == 0) {
      __out_1->level_id = (RK_U8)_out_3;
      if (0x6a < __out_1->level_id) {
        val_temp = 0xffffffff;
        _mpp_log_l(2,"avs2d_ps","level_id 0x%02x is not supported.\n","avs2d_parse_sequence_header",
                   (ulong)__out_1->level_id);
        return val_temp;
      }
      MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_4);
      vsh->seq_rps[0].reserved = MVar1;
      if (vsh->seq_rps[0].reserved == 0) {
        __out_1->progressive_sequence = (RK_U8)_out_4;
        MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_5);
        vsh->seq_rps[0].reserved = MVar1;
        if (vsh->seq_rps[0].reserved == 0) {
          __out_1->field_coded_sequence = (RK_U8)_out_5;
          MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,0xe,&_out_6);
          vsh->seq_rps[0].reserved = MVar1;
          if (vsh->seq_rps[0].reserved == 0) {
            __out_1->horizontal_size = _out_6;
            MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,0xe,&_out_7);
            vsh->seq_rps[0].reserved = MVar1;
            if (vsh->seq_rps[0].reserved == 0) {
              __out_1->vertical_size = _out_7;
              if ((__out_1->horizontal_size < 0x10) || (__out_1->vertical_size < 0x10)) {
                val_temp = 0xffffffff;
                _mpp_log_l(2,"avs2d_ps","invalid sequence width(%d), height(%d).\n",
                           "avs2d_parse_sequence_header",(ulong)__out_1->horizontal_size,
                           (ulong)__out_1->vertical_size);
                return val_temp;
              }
              MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,2,&_out_8);
              vsh->seq_rps[0].reserved = MVar1;
              if (vsh->seq_rps[0].reserved == 0) {
                __out_1->chroma_format = (RK_U8)_out_8;
                if (__out_1->chroma_format != '\x01') {
                  val_temp = 0xffffffff;
                  _mpp_log_l(2,"avs2d_ps","chroma_format 0x%02x is not supported.\n",
                             "avs2d_parse_sequence_header",(ulong)__out_1->chroma_format);
                  return val_temp;
                }
                MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,3,&_out_9);
                vsh->seq_rps[0].reserved = MVar1;
                if (vsh->seq_rps[0].reserved == 0) {
                  __out_1->sample_precision = (RK_U8)_out_9;
                  if (__out_1->profile_id == '\"') {
                    MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,3,&_out_10);
                    vsh->seq_rps[0].reserved = MVar1;
                    if (vsh->seq_rps[0].reserved != 0) goto LAB_001adf57;
                    __out_1->encoding_precision = (RK_U8)_out_10;
                  }
                  else {
                    __out_1->encoding_precision = '\x01';
                  }
                  __out_1->bit_depth = __out_1->encoding_precision * '\x02' + '\x06';
                  if ((__out_1->sample_precision == '\0') || (2 < __out_1->sample_precision)) {
                    val_temp = 0xffffffff;
                    _mpp_log_l(2,"avs2d_ps","sample_precision 0x%02x is not supported.\n",
                               "avs2d_parse_sequence_header",(ulong)__out_1->sample_precision);
                    return val_temp;
                  }
                  if ((__out_1->encoding_precision == '\0') || (2 < __out_1->encoding_precision)) {
                    val_temp = 0xffffffff;
                    _mpp_log_l(2,"avs2d_ps","encoding_precision 0x%02x is not supported.\n",
                               "avs2d_parse_sequence_header",(ulong)__out_1->encoding_precision);
                    return val_temp;
                  }
                  MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,4,&_out_11);
                  vsh->seq_rps[0].reserved = MVar1;
                  if (vsh->seq_rps[0].reserved == 0) {
                    __out_1->aspect_ratio = (RK_U8)_out_11;
                    MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,4,(RK_S32 *)abStack_6c);
                    vsh->seq_rps[0].reserved = MVar1;
                    if (vsh->seq_rps[0].reserved == 0) {
                      __out_1->frame_rate_code = abStack_6c[0];
                      MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,0x12,&_out_12);
                      vsh->seq_rps[0].reserved = MVar1;
                      if (vsh->seq_rps[0].reserved == 0) {
                        rps._4_4_ = _out_12;
                        __out_1->bit_rate = _out_12 << 0xc;
                        MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_14);
                        vsh->seq_rps[0].reserved = MVar1;
                        if (vsh->seq_rps[0].reserved == 0) {
                          _out_13._3_1_ = (char)_out_14;
                          if (((char)_out_14 != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
                            _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",
                                       (char *)0x0,0x157);
                          }
                          MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,0xc,&stack0xffffffffffffff84);
                          vsh->seq_rps[0].reserved = MVar1;
                          if (vsh->seq_rps[0].reserved == 0) {
                            rps._4_4_ = iStack_7c;
                            __out_1->bit_rate = iStack_7c + __out_1->bit_rate;
                            MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_15);
                            vsh->seq_rps[0].reserved = MVar1;
                            if (vsh->seq_rps[0].reserved == 0) {
                              __out_1->low_delay = (RK_U8)_out_15;
                              MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_17);
                              vsh->seq_rps[0].reserved = MVar1;
                              if (vsh->seq_rps[0].reserved == 0) {
                                _out_16._3_1_ = (char)_out_17;
                                if (((char)_out_17 != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
                                  _mpp_log_l(4,"avs2d_ps",
                                             "expected marker_bit 1 while received 0(%d).\n",
                                             (char *)0x0,0x15b);
                                }
                                MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_18);
                                vsh->seq_rps[0].reserved = MVar1;
                                if (vsh->seq_rps[0].reserved == 0) {
                                  __out_1->enable_temporal_id = (RK_U8)_out_18;
                                  MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,0x12,&_out_19);
                                  vsh->seq_rps[0].reserved = MVar1;
                                  if (vsh->seq_rps[0].reserved == 0) {
                                    __out_1->bbv_buffer_size = _out_19;
                                    MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,3,&_out_20);
                                    vsh->seq_rps[0].reserved = MVar1;
                                    if (vsh->seq_rps[0].reserved == 0) {
                                      __out_1->lcu_size = (RK_U8)_out_20;
                                      if ((__out_1->lcu_size < 4) || (6 < __out_1->lcu_size)) {
                                        val_temp = 0xffffffff;
                                        _mpp_log_l(2,"avs2d_ps","invalid lcu size: %d\n",
                                                   "avs2d_parse_sequence_header",
                                                   (ulong)__out_1->lcu_size);
                                        return val_temp;
                                      }
                                      MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_21);
                                      vsh->seq_rps[0].reserved = MVar1;
                                      if (vsh->seq_rps[0].reserved == 0) {
                                        __out_1->enable_weighted_quant = (RK_U8)_out_21;
                                        if (__out_1->enable_weighted_quant != '\0') {
                                          parse_sequence_wqm((BitReadCtx_t *)vsh,__out_1);
                                        }
                                        MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_22);
                                        vsh->seq_rps[0].reserved = MVar1;
                                        if (vsh->seq_rps[0].reserved == 0) {
                                          rps._4_4_ = _out_22;
                                          __out_1->enable_background_picture = (byte)_out_22 ^ 1;
                                          MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_23);
                                          vsh->seq_rps[0].reserved = MVar1;
                                          if (vsh->seq_rps[0].reserved == 0) {
                                            __out_1->enable_mhp_skip = (RK_U8)_out_23;
                                            MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_24);
                                            vsh->seq_rps[0].reserved = MVar1;
                                            if (vsh->seq_rps[0].reserved == 0) {
                                              __out_1->enable_dhp = (RK_U8)_out_24;
                                              MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_25);
                                              vsh->seq_rps[0].reserved = MVar1;
                                              if (vsh->seq_rps[0].reserved == 0) {
                                                __out_1->enable_wsm = (RK_U8)_out_25;
                                                MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,&_out_26
                                                                     );
                                                vsh->seq_rps[0].reserved = MVar1;
                                                if (vsh->seq_rps[0].reserved == 0) {
                                                  __out_1->enable_amp = (RK_U8)_out_26;
                                                  MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,
                                                                        &_out_27);
                                                  vsh->seq_rps[0].reserved = MVar1;
                                                  if (vsh->seq_rps[0].reserved == 0) {
                                                    __out_1->enable_nsqt = (RK_U8)_out_27;
                                                    MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,
                                                                          &_out_28);
                                                    vsh->seq_rps[0].reserved = MVar1;
                                                    if (vsh->seq_rps[0].reserved == 0) {
                                                      __out_1->enable_nsip = (RK_U8)_out_28;
                                                      MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,
                                                                            &_out_29);
                                                      vsh->seq_rps[0].reserved = MVar1;
                                                      if (vsh->seq_rps[0].reserved == 0) {
                                                        __out_1->enable_2nd_transform =
                                                             (RK_U8)_out_29;
                                                        MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,
                                                                              &_out_30);
                                                        vsh->seq_rps[0].reserved = MVar1;
                                                        if (vsh->seq_rps[0].reserved == 0) {
                                                          __out_1->enable_sao = (RK_U8)_out_30;
                                                          MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,
                                                                                1,(RK_S32 *)
                                                                                  aRStack_c0);
                                                          vsh->seq_rps[0].reserved = MVar1;
                                                          if (vsh->seq_rps[0].reserved == 0) {
                                                            __out_1->enable_alf = aRStack_c0[0];
                                                            MVar1 = mpp_read_bits((BitReadCtx_t *)
                                                                                  vsh,1,&_out_31);
                                                            vsh->seq_rps[0].reserved = MVar1;
                                                            if (vsh->seq_rps[0].reserved == 0) {
                                                              __out_1->enable_pmvr = (RK_U8)_out_31;
                                                              MVar1 = mpp_read_bits((BitReadCtx_t *)
                                                                                    vsh,1,&_out_33);
                                                              vsh->seq_rps[0].reserved = MVar1;
                                                              if (vsh->seq_rps[0].reserved == 0) {
                                                                _out_32._3_1_ = (char)_out_33;
                                                                if (((char)_out_33 != '\x01') &&
                                                                   ((avs2d_parse_debug & 4) != 0)) {
                                                                  _mpp_log_l(4,"avs2d_ps",
                                                                                                                                                          
                                                  "expected marker_bit 1 while received 0(%d).\n",
                                                  (char *)0x0,0x176);
                                                  }
                                                  MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,6,
                                                                        &_out_34);
                                                  vsh->seq_rps[0].reserved = MVar1;
                                                  if (vsh->seq_rps[0].reserved == 0) {
                                                    __out_1->num_of_rps = (RK_U8)_out_34;
                                                    local_20 = 0;
                                                    while( true ) {
                                                      if (__out_1->num_of_rps <= local_20) break;
                                                      bitctx = (BitReadCtx_t *)
                                                               (__out_1->seq_rps + local_20);
                                                      if ((avs2d_parse_debug & 8) != 0) {
                                                        _mpp_log_l(4,"avs2d_ps",
                                                                   "--------rcs[%d]--------",
                                                                   "avs2d_parse_sequence_header",
                                                                   (ulong)local_20);
                                                      }
                                                      val_temp = parse_one_rps((BitReadCtx_t *)vsh,
                                                                               (Avs2dRps_t *)bitctx)
                                                      ;
                                                      if ((int)val_temp < MPP_OK) {
                                                        if ((avs2d_parse_debug & 4) == 0) {
                                                          return val_temp;
                                                        }
                                                        _mpp_log_l(4,"avs2d_ps",
                                                                   "Function error(%d).\n",
                                                                   (char *)0x0,0x17d);
                                                        return val_temp;
                                                      }
                                                      local_20 = local_20 + 1;
                                                    }
                                                    if (__out_1->low_delay == '\0') {
                                                      MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,5,
                                                                            &_out_35);
                                                      vsh->seq_rps[0].reserved = MVar1;
                                                      if (vsh->seq_rps[0].reserved != 0)
                                                      goto LAB_001adf57;
                                                      __out_1->picture_reorder_delay =
                                                           (RK_U8)_out_35;
                                                    }
                                                    else {
                                                      __out_1->picture_reorder_delay = '\0';
                                                    }
                                                    MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,1,
                                                                          (RK_S32 *)local_d8);
                                                    vsh->seq_rps[0].reserved = MVar1;
                                                    if (vsh->seq_rps[0].reserved == 0) {
                                                      __out_1->enable_clf = local_d8[0];
                                                      MVar1 = mpp_read_bits((BitReadCtx_t *)vsh,2,
                                                                            &local_dc);
                                                      vsh->seq_rps[0].reserved = MVar1;
                                                      if (vsh->seq_rps[0].reserved == 0) {
                                                        rps._4_4_ = local_dc;
                                                        if ((local_dc != 0) &&
                                                           ((avs2d_parse_debug & 4) != 0)) {
                                                          _mpp_log_l(4,"avs2d_ps",
                                                                     "reserver bits error.\n",
                                                                     (char *)0x0);
                                                        }
                                                        return val_temp;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001adf57:
  return vsh->seq_rps[0].reserved;
}

Assistant:

MPP_RET avs2d_parse_sequence_header(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    RK_U32 val_temp = 0;
    Avs2dRps_t *rps = NULL;
    BitReadCtx_t *bitctx = &p_dec->bitctx;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;

    AVS2D_PARSE_TRACE("Bitread buf %p, data %p, buf_len %d, left %d\n", bitctx->buf, bitctx->data_, bitctx->buf_len, bitctx->bytes_left_);
    memset(vsh, 0, sizeof(Avs2dSeqHeader_t));
    READ_BITS(bitctx, 8, &vsh->profile_id);
    //!< check profile_id
    if (vsh->profile_id != 0x12 && vsh->profile_id != 0x20 && vsh->profile_id != 0x22) {
        ret = MPP_NOK;
        mpp_err_f("profile_id 0x%02x is not supported.\n", vsh->profile_id);
        goto __FAILED;
    }
    READ_BITS(bitctx, 8, &vsh->level_id);
    if (vsh->level_id > 0x6A) {
        ret = MPP_NOK;
        mpp_err_f("level_id 0x%02x is not supported.\n", vsh->level_id);
        goto __FAILED;
    }
    READ_ONEBIT(bitctx, &vsh->progressive_sequence);
    READ_ONEBIT(bitctx, &vsh->field_coded_sequence);
    READ_BITS(bitctx, 14, &vsh->horizontal_size);
    READ_BITS(bitctx, 14, &vsh->vertical_size);
    if (vsh->horizontal_size < 16 || vsh->vertical_size < 16) {
        ret = MPP_NOK;
        mpp_err_f("invalid sequence width(%d), height(%d).\n",
                  vsh->horizontal_size, vsh->vertical_size);
        goto __FAILED;
    }

    READ_BITS(bitctx, 2,  &vsh->chroma_format);
    if (vsh->chroma_format != CHROMA_420) {
        ret = MPP_NOK;
        mpp_err_f("chroma_format 0x%02x is not supported.\n", vsh->chroma_format);
        goto __FAILED;
    }
    READ_BITS(bitctx, 3, &vsh->sample_precision);
    if (vsh->profile_id == MAIN10_PROFILE) {
        READ_BITS(bitctx, 3, &vsh->encoding_precision);
    } else {
        vsh->encoding_precision = 1;
    }
    vsh->bit_depth = 6 + (vsh->encoding_precision << 1);

    if (vsh->sample_precision < 1 || vsh->sample_precision > 2) {
        ret = MPP_NOK;
        mpp_err_f("sample_precision 0x%02x is not supported.\n", vsh->sample_precision);
        goto __FAILED;
    }
    if (vsh->encoding_precision < 1 || vsh->encoding_precision > 2) {
        ret = MPP_NOK;
        mpp_err_f("encoding_precision 0x%02x is not supported.\n", vsh->encoding_precision);
        goto __FAILED;
    }

    READ_BITS(bitctx, 4, &vsh->aspect_ratio);
    READ_BITS(bitctx, 4, &vsh->frame_rate_code);
    READ_BITS(bitctx, 18, &val_temp); //!< bit_rate_lower_18
    vsh->bit_rate = val_temp << 12;
    READ_MARKER_BIT(bitctx);
    READ_BITS(bitctx, 12, &val_temp); //!< bit_rate_upper_12
    vsh->bit_rate += val_temp;
    READ_ONEBIT(bitctx, &vsh->low_delay);
    READ_MARKER_BIT(bitctx);
    READ_ONEBIT(bitctx, &vsh->enable_temporal_id);
    READ_BITS(bitctx, 18, &vsh->bbv_buffer_size);
    READ_BITS(bitctx, 3, &vsh->lcu_size);
    if (vsh->lcu_size < 4 || vsh->lcu_size > 6) {
        ret = MPP_NOK;
        mpp_err_f("invalid lcu size: %d\n", vsh->lcu_size);
        goto __FAILED;
    }

    READ_ONEBIT(bitctx, &vsh->enable_weighted_quant);
    if (vsh->enable_weighted_quant) {
        parse_sequence_wqm(bitctx, vsh);
    }

    READ_ONEBIT(bitctx, &val_temp);
    vsh->enable_background_picture = val_temp ^ 0x01;
    READ_ONEBIT(bitctx, &vsh->enable_mhp_skip);
    READ_ONEBIT(bitctx, &vsh->enable_dhp);
    READ_ONEBIT(bitctx, &vsh->enable_wsm);
    READ_ONEBIT(bitctx, &vsh->enable_amp);
    READ_ONEBIT(bitctx, &vsh->enable_nsqt);
    READ_ONEBIT(bitctx, &vsh->enable_nsip);
    READ_ONEBIT(bitctx, &vsh->enable_2nd_transform);
    READ_ONEBIT(bitctx, &vsh->enable_sao);
    READ_ONEBIT(bitctx, &vsh->enable_alf);
    READ_ONEBIT(bitctx, &vsh->enable_pmvr);
    READ_MARKER_BIT(bitctx);

    //!< parse rps
    READ_BITS(bitctx, 6, &vsh->num_of_rps);
    for (i = 0; i < vsh->num_of_rps; i++) {
        rps = &vsh->seq_rps[i];
        AVS2D_PARSE_TRACE("--------rcs[%d]--------", i);
        FUN_CHECK(ret = parse_one_rps(bitctx, rps));
    }

    if (vsh->low_delay == 0) {
        READ_BITS(bitctx, 5, &vsh->picture_reorder_delay);
    } else {
        vsh->picture_reorder_delay = 0;
    }
    READ_ONEBIT(bitctx, &vsh->enable_clf);
    READ_BITS(bitctx, 2, &val_temp); //!< reserved 2bits 00
    if (val_temp) {
        AVS2D_DBG(AVS2D_DBG_WARNNING, "reserver bits error.\n");
    }
    return ret;
__BITREAD_ERR:
    return ret = bitctx->ret;
__FAILED:
    return ret;
}